

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O0

void __thiscall Board::Board(Board *this,string *title,string *subtitle)

{
  string *subtitle_local;
  string *title_local;
  Board *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)title);
  std::__cxx11::string::string((string *)&this->board_subtitle,(string *)subtitle);
  return;
}

Assistant:

Board(std::string title = "", std::string subtitle = "") :
      board_title{title}, board_subtitle{subtitle} {}